

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  curl_proxytype cVar1;
  Curl_easy *pCVar2;
  char *first;
  Curl_share *pCVar3;
  curl_ssl_session *pcVar4;
  char *second;
  long lVar5;
  ssl_primary_config *data;
  proxy_info *ppVar6;
  _Bool _Var7;
  int iVar8;
  long *plVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  
  cVar1 = (conn->http_proxy).proxytype;
  if (cVar1 == CURLPROXY_HTTPS) {
    bVar10 = (conn->bits).proxy_ssl_connected[sockindex] ^ 1;
  }
  else {
    bVar10 = 0;
  }
  data = &conn->ssl_config;
  ppVar6 = (proxy_info *)&conn->host;
  if (bVar10 == 0) {
    iVar11 = conn->remote_port;
  }
  else {
    iVar11 = (int)conn->port;
    data = &conn->proxy_ssl_config;
    ppVar6 = &conn->http_proxy;
  }
  pCVar2 = conn->data;
  first = (ppVar6->host).name;
  *ssl_sessionid = (void *)0x0;
  if ((cVar1 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if ((pCVar2->set).proxy_ssl.primary.sessionid == false) {
      return true;
    }
  }
  else if ((pCVar2->set).ssl.primary.sessionid != true) {
    return true;
  }
  pCVar3 = pCVar2->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
    plVar9 = &(pCVar2->state).sessionage;
  }
  else {
    plVar9 = &pCVar3->sessionage;
  }
  bVar15 = (pCVar2->set).general_ssl.max_ssl_sessions == 0;
  if (!bVar15) {
    lVar13 = 0x38;
    uVar12 = 0;
    do {
      pcVar4 = (pCVar2->state).session;
      if ((*(long *)((long)pcVar4 + lVar13 + -0x20) != 0) &&
         (iVar8 = Curl_strcasecompare(first,*(char **)((long)pcVar4 + lVar13 + -0x38)), iVar8 != 0))
      {
        if ((conn->bits).conn_to_host == false) {
          if (*(long *)((long)pcVar4 + lVar13 + -0x30) == 0) {
LAB_0014b379:
            if ((conn->bits).conn_to_port == false) {
              if (*(int *)((long)pcVar4 + lVar13 + -4) == -1) {
LAB_0014b3a3:
                if (((iVar11 == *(int *)((long)pcVar4 + lVar13 + -8)) &&
                    (iVar8 = Curl_strcasecompare(conn->handler->scheme,
                                                 *(char **)((long)pcVar4 + lVar13 + -0x28)),
                    iVar8 != 0)) &&
                   (_Var7 = Curl_ssl_config_matches
                                      (data,(ssl_primary_config *)((long)&pcVar4->name + lVar13)),
                   _Var7)) {
                  lVar5 = *plVar9;
                  *plVar9 = lVar5 + 1;
                  *(long *)((long)pcVar4 + lVar13 + -0x10) = lVar5 + 1;
                  *ssl_sessionid = *(void **)((long)pcVar4 + lVar13 + -0x20);
                  if (idsize != (size_t *)0x0) {
                    *idsize = *(size_t *)((long)pcVar4 + lVar13 + -0x18);
                  }
                  return false;
                }
              }
            }
            else {
              iVar8 = *(int *)((long)pcVar4 + lVar13 + -4);
              if ((iVar8 != -1) && (conn->conn_to_port == iVar8)) goto LAB_0014b3a3;
            }
          }
        }
        else {
          second = *(char **)((long)pcVar4 + lVar13 + -0x30);
          if ((second != (char *)0x0) &&
             (iVar8 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar8 != 0))
          goto LAB_0014b379;
        }
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x80;
      bVar14 = uVar12 < (pCVar2->set).general_ssl.max_ssl_sessions;
      bVar15 = !bVar14;
    } while (bVar14);
  }
  return bVar15;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid))
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}